

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

void __thiscall
cuckoocache_tests::cuckoocache_hit_rate_ok::test_method(cuckoocache_hit_rate_ok *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  double load;
  double dVar1;
  double dVar2;
  const_string msg;
  const_string file;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (load = 0.1; load < 2.0; load = load + load) {
    dVar1 = HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
                      (&this->super_HitRateTest,4,load);
    local_48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x78;
    file.m_begin = (iterator)&local_48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    dVar2 = 1.0;
    if (1.0 <= load) {
      dVar2 = load;
    }
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(0.98 < dVar2 * dVar1);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "normalize_hit_rate(hits, load) > HitRateThresh";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_a8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,(check_type)load,(size_t)&local_b0,0x78);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(cuckoocache_hit_rate_ok, HitRateTest)
{
    /** Arbitrarily selected Hit Rate threshold that happens to work for this test
     * as a lower bound on performance.
     */
    double HitRateThresh = 0.98;
    size_t megabytes = 4;
    for (double load = 0.1; load < 2; load *= 2) {
        double hits = test_cache<CuckooCache::cache<uint256, SignatureCacheHasher>>(megabytes, load);
        BOOST_CHECK(normalize_hit_rate(hits, load) > HitRateThresh);
    }
}